

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Measurement.hpp
# Opt level: O1

void __thiscall
ableton::link::
Measurement<ableton::platforms::asio::AsioService,_ableton::platforms::linux::Clock<1>,_ableton::discovery::Socket<512UL>,_ableton::util::NullLog>
::ImplDeleter::operator()(ImplDeleter *this)

{
  Impl *this_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_01;
  
  this_00 = (this->mpImpl).
            super___shared_ptr<ableton::link::Measurement<ableton::platforms::asio::AsioService,_ableton::platforms::linux::Clock<1>,_ableton::discovery::Socket<512UL>,_ableton::util::NullLog>::Impl,_(__gnu_cxx::_Lock_policy)2>
            ._M_ptr;
  if (this_00->mSuccess == false) {
    Impl::fail(this_00);
  }
  this_01 = (this->mpImpl).
            super___shared_ptr<ableton::link::Measurement<ableton::platforms::asio::AsioService,_ableton::platforms::linux::Clock<1>,_ableton::discovery::Socket<512UL>,_ableton::util::NullLog>::Impl,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount._M_pi;
  (this->mpImpl).
  super___shared_ptr<ableton::link::Measurement<ableton::platforms::asio::AsioService,_ableton::platforms::linux::Clock<1>,_ableton::discovery::Socket<512UL>,_ableton::util::NullLog>::Impl,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)0x0;
  (this->mpImpl).
  super___shared_ptr<ableton::link::Measurement<ableton::platforms::asio::AsioService,_ableton::platforms::linux::Clock<1>,_ableton::discovery::Socket<512UL>,_ableton::util::NullLog>::Impl,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  if (this_01 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_01);
    return;
  }
  return;
}

Assistant:

void operator()()
    {
      // Notify callback that the measurement has failed if it did
      // not succeed before destruction
      if (!mpImpl->mSuccess)
      {
        mpImpl->fail();
      }
      mpImpl.reset();
    }